

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall GlobOpt::CollectMemcopyStElementI(GlobOpt *this,Instr *instr,Loop *loop)

{
  MemOpCandidate *this_00;
  code *pcVar1;
  bool bVar2;
  SymID SVar3;
  uint uVar4;
  uint uVar5;
  SymID SVar6;
  SymID SVar7;
  Opnd *pOVar8;
  undefined4 *puVar9;
  IndirOpnd *this_01;
  RegOpnd *indexOpnd;
  RegOpnd *pRVar10;
  StackSym *pSVar11;
  JITTimeFunctionBody *pJVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  Type *ppMVar15;
  MemCopyCandidate *pMVar16;
  Instr *__instr___2;
  char16 debugStringBuffer_2 [42];
  SymID local_134;
  bool isIndexPreIncr;
  Instr *pIStack_130;
  SymID inductionSymID;
  Instr *__instr___1;
  char16 debugStringBuffer_1 [42];
  MemCopyCandidate *memcopyInfo;
  MemOpCandidate *previousCandidate;
  SymID srcSymID;
  Instr *__instr__;
  char16 debugStringBuffer [42];
  RegOpnd *src1;
  SymID baseSymID;
  RegOpnd *baseOp;
  Opnd *indexOp;
  IndirOpnd *dst;
  Loop *loop_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  if ((loop->memOpInfo == (MemOpInfo *)0x0) ||
     (bVar2 = SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Empty
                        ((SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
                         loop->memOpInfo->candidates), bVar2)) {
    return false;
  }
  pOVar8 = IR::Instr::GetDst(instr);
  bVar2 = IR::Opnd::IsIndirOpnd(pOVar8);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x81a,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pOVar8 = IR::Instr::GetDst(instr);
  this_01 = IR::Opnd::AsIndirOpnd(pOVar8);
  indexOpnd = IR::IndirOpnd::GetIndexOpnd(this_01);
  pRVar10 = IR::IndirOpnd::GetBaseOpnd(this_01);
  pRVar10 = IR::Opnd::AsRegOpnd(&pRVar10->super_Opnd);
  pSVar11 = IR::Opnd::GetStackSym(&pRVar10->super_Opnd);
  SVar3 = GetVarSymID(this,pSVar11);
  pOVar8 = IR::Instr::GetSrc1(instr);
  bVar2 = IR::Opnd::IsRegOpnd(pOVar8);
  if (!bVar2) {
    return false;
  }
  pOVar8 = IR::Instr::GetSrc1(instr);
  register0x00000000 = IR::Opnd::AsRegOpnd(pOVar8);
  bVar2 = IR::Opnd::GetIsDead(&register0x00000000->super_Opnd);
  if (!bVar2) {
    if ((DAT_01ec73ca & 1) != 0) {
      uVar4 = Func::GetSourceContextId(this->func);
      uVar5 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar4,uVar5);
      if (!bVar2) {
        uVar4 = Func::GetSourceContextId(this->func);
        uVar5 = Func::GetLocalFunctionId(this->func);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemCopyPhase,uVar4,uVar5);
        if (!bVar2) {
          return false;
        }
      }
      Output::Print(L"TRACE MemCopy:");
      pJVar12 = Func::GetJITFunctionBody(this->func);
      pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr__);
      uVar4 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar4);
      Output::Print(L"Source (s%d) is still alive after StElemI",(ulong)SVar3);
      if (instr != (Instr *)0x0) {
        IR::Instr::DumpByteCodeOffset(instr);
        pcVar13 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
        Output::Print(L" (%s)",pcVar13);
      }
      Output::Print(L"\n");
      Output::Flush();
    }
    return false;
  }
  bVar2 = IsAllowedForMemOpt(this,instr,false,pRVar10,&indexOpnd->super_Opnd);
  if (!bVar2) {
    return false;
  }
  pSVar11 = IR::Opnd::GetStackSym(&stack0xffffffffffffffb0->super_Opnd);
  SVar6 = GetVarSymID(this,pSVar11);
  ppMVar15 = SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Head
                       ((SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
                        loop->memOpInfo->candidates);
  this_00 = *ppMVar15;
  bVar2 = Loop::MemOpCandidate::IsMemCopy(this_00);
  if (!bVar2) {
    return false;
  }
  pMVar16 = Loop::MemOpCandidate::AsMemCopy(this_00);
  if (((pMVar16->super_MemOpCandidate).base != 0xffffffff) ||
     (SVar7 = GetVarSymID(this,pMVar16->transferSym), SVar7 != SVar6)) {
    if ((DAT_01ec73ca & 1) != 0) {
      uVar4 = Func::GetSourceContextId(this->func);
      uVar5 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar4,uVar5);
      if (!bVar2) {
        uVar4 = Func::GetSourceContextId(this->func);
        uVar5 = Func::GetLocalFunctionId(this->func);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemCopyPhase,uVar4,uVar5);
        if (!bVar2) {
          return false;
        }
      }
      Output::Print(L"TRACE MemCopy:");
      pJVar12 = Func::GetJITFunctionBody(this->func);
      pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr___1);
      uVar4 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar4);
      Output::Print(L"No matching LdElem found (s%d)",(ulong)SVar3);
      pIStack_130 = instr;
      if (instr != (Instr *)0x0) {
        IR::Instr::DumpByteCodeOffset(instr);
      }
      if (pIStack_130 != (Instr *)0x0) {
        pcVar13 = Js::OpCodeUtil::GetOpCodeName(pIStack_130->m_opcode);
        Output::Print(L" (%s)",pcVar13);
      }
      Output::Print(L"\n");
      Output::Flush();
    }
    return false;
  }
  pSVar11 = IR::Opnd::GetStackSym(&indexOpnd->super_Opnd);
  if (pSVar11 == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x847,"(indexOp->GetStackSym())","indexOp->GetStackSym()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pSVar11 = IR::Opnd::GetStackSym(&indexOpnd->super_Opnd);
  local_134 = GetVarSymID(this,pSVar11);
  bVar2 = IsSymIDInductionVariable(this,local_134,loop);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x849,"(IsSymIDInductionVariable(inductionSymID, loop))",
                       "IsSymIDInductionVariable(inductionSymID, loop)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar2 = JsUtil::
          BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(loop->memOpInfo->inductionVariableChangeInfoMap,&local_134);
  if (bVar2 != (bool)((pMVar16->super_MemOpCandidate).bIndexAlreadyChanged & 1U)) {
    if ((DAT_01ec73ca & 1) != 0) {
      uVar4 = Func::GetSourceContextId(this->func);
      uVar5 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar4,uVar5);
      if (!bVar2) {
        uVar4 = Func::GetSourceContextId(this->func);
        uVar5 = Func::GetLocalFunctionId(this->func);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemCopyPhase,uVar4,uVar5);
        if (!bVar2) {
          return false;
        }
      }
      Output::Print(L"TRACE MemCopy:");
      pJVar12 = Func::GetJITFunctionBody(this->func);
      pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr___2);
      uVar4 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar4);
      Output::Print(L"Index value changed between ldElem and stElem");
      if (instr != (Instr *)0x0) {
        IR::Instr::DumpByteCodeOffset(instr);
        pcVar13 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
        Output::Print(L" (%s)",pcVar13);
      }
      Output::Print(L"\n");
      Output::Flush();
    }
    return false;
  }
  (pMVar16->super_MemOpCandidate).count = (pMVar16->super_MemOpCandidate).count + '\x01';
  if (1 < (pMVar16->super_MemOpCandidate).count) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x854,"(memcopyInfo->count <= 1)","memcopyInfo->count <= 1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  (pMVar16->super_MemOpCandidate).base = SVar3;
  return true;
}

Assistant:

bool GlobOpt::CollectMemcopyStElementI(IR::Instr *instr, Loop *loop)
{
    if (!loop->memOpInfo || loop->memOpInfo->candidates->Empty())
    {
        // There is no ldElem matching this stElem
        return false;
    }

    Assert(instr->GetDst()->IsIndirOpnd());
    IR::IndirOpnd *dst = instr->GetDst()->AsIndirOpnd();
    IR::Opnd *indexOp = dst->GetIndexOpnd();
    IR::RegOpnd *baseOp = dst->GetBaseOpnd()->AsRegOpnd();
    SymID baseSymID = GetVarSymID(baseOp->GetStackSym());

    if (!instr->GetSrc1()->IsRegOpnd())
    {
        return false;
    }
    IR::RegOpnd* src1 = instr->GetSrc1()->AsRegOpnd();

    if (!src1->GetIsDead())
    {
        // This must be the last use of the register.
        // It will invalidate `var m = a[i]; b[i] = m;` but this is not a very interesting case.
        TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("Source (s%d) is still alive after StElemI"), baseSymID);
        return false;
    }

    if (!IsAllowedForMemOpt(instr, false, baseOp, indexOp))
    {
        return false;
    }

    SymID srcSymID = GetVarSymID(src1->GetStackSym());

    // Prepare the memcopyCandidate entry
    Loop::MemOpCandidate* previousCandidate = loop->memOpInfo->candidates->Head();
    if (!previousCandidate->IsMemCopy())
    {
        return false;
    }
    Loop::MemCopyCandidate* memcopyInfo = previousCandidate->AsMemCopy();

    // The previous candidate has to have been created by the matching ldElem
    if (
        memcopyInfo->base != Js::Constants::InvalidSymID ||
        GetVarSymID(memcopyInfo->transferSym) != srcSymID
    )
    {
        TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("No matching LdElem found (s%d)"), baseSymID);
        return false;
    }

    Assert(indexOp->GetStackSym());
    SymID inductionSymID = GetVarSymID(indexOp->GetStackSym());
    Assert(IsSymIDInductionVariable(inductionSymID, loop));
    bool isIndexPreIncr = loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(inductionSymID);
    if (isIndexPreIncr != memcopyInfo->bIndexAlreadyChanged)
    {
        // The index changed between the load and the store
        TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("Index value changed between ldElem and stElem"));
        return false;
    }

    // Consider: Can we remove the count field?
    memcopyInfo->count++;
    AssertOrFailFast(memcopyInfo->count <= 1);
    memcopyInfo->base = baseSymID;

    return true;
}